

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventfd-ctx-test.c
# Opt level: O2

void * write_fun(void *arg)

{
  ssize_t sVar1;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    if (*(int *)((long)arg + 8) <= iVar2) {
      return (void *)0x0;
    }
    sVar1 = write(*(int *)((long)arg + 0xc),arg,8);
    if (sVar1 != 8) break;
    usleep(100);
    iVar2 = iVar2 + 1;
  }
  microatf_fail_require
            ("%s:%d: %s not met",
             "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/eventfd-ctx-test.c"
             ,0x1b9,
             "(s = write(td->efd, &td->ev_count, sizeof(td->ev_count))) == sizeof(td->ev_count)");
}

Assistant:

static void *
write_fun(void *arg)
{
	WriteThreadArgs *td = arg;
	ssize_t s;
	int i;

	for (i = 0; i < td->loop; i++) {
		ATF_REQUIRE(
		    (s = write(td->efd, &td->ev_count, sizeof(td->ev_count))) ==
		    sizeof(td->ev_count));
		usleep(100);
	}
	return (NULL);
}